

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  int *piVar4;
  seqStore_t *psVar5;
  U32 lowestValid_1;
  int iVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  BYTE *pBVar11;
  U32 UVar12;
  U32 UVar13;
  ulong uVar14;
  int *piVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  int *piVar18;
  long lVar19;
  ulong uVar20;
  int *piVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  seqDef *psVar25;
  U32 UVar26;
  size_t ofbCandidate;
  U32 maxDistance;
  uint local_d4;
  size_t local_d0;
  ZSTD_matchState_t *local_c8;
  int *local_c0;
  int local_b8;
  uint local_b4;
  ulong local_b0;
  BYTE *local_a8;
  ulong local_a0;
  uint local_94;
  int *local_90;
  seqStore_t *local_88;
  int *local_80;
  BYTE *local_78;
  BYTE *local_70;
  U32 local_64;
  int *local_60;
  ulong local_58;
  int *local_50;
  int *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  local_c0 = (int *)((long)src + srcSize);
  local_90 = (int *)((long)src + (srcSize - 8));
  local_70 = (ms->window).base;
  local_a8 = (ms->window).dictBase;
  uVar23 = (ms->window).dictLimit;
  local_a0 = (ulong)uVar23;
  local_78 = local_70 + local_a0;
  uVar7 = (ms->window).lowLimit;
  uVar8 = (ms->cParams).windowLog;
  uVar2 = (ms->cParams).minMatch;
  uVar22 = 6;
  if (uVar2 < 6) {
    uVar22 = uVar2;
  }
  local_94 = 4;
  if (4 < uVar22) {
    local_94 = uVar22;
  }
  local_d4 = *rep;
  UVar26 = rep[1];
  ms->lazySkipping = 0;
  piVar21 = (int *)((ulong)(local_78 == (BYTE *)src) + (long)src);
  local_40 = rep;
  if (piVar21 < local_90) {
    local_60 = (int *)(local_a8 + local_a0);
    local_38 = local_a8 + uVar7;
    local_b4 = 1 << ((byte)uVar8 & 0x1f);
    local_b8 = uVar23 - 1;
    local_48 = local_c0 + -8;
    local_c8 = ms;
    local_88 = seqStore;
    do {
      uVar23 = (int)piVar21 - (int)local_70;
      local_58 = (ulong)uVar23;
      iVar6 = uVar23 + 1;
      UVar13 = (local_c8->window).lowLimit;
      UVar12 = iVar6 - local_b4;
      if (iVar6 - UVar13 <= local_b4) {
        UVar12 = UVar13;
      }
      if (local_c8->loadedDictEnd != 0) {
        UVar12 = UVar13;
      }
      uVar7 = iVar6 - local_d4;
      pBVar16 = local_70;
      if (uVar7 < (uint)local_a0) {
        pBVar16 = local_a8;
      }
      local_50 = (int *)src;
      if (local_b8 - uVar7 < 3) {
LAB_001538ee:
        uVar20 = 0;
      }
      else {
        uVar20 = 0;
        if (local_d4 <= (uVar23 - UVar12) + 1) {
          if (*(int *)((long)piVar21 + 1) != *(int *)(pBVar16 + uVar7)) goto LAB_001538ee;
          piVar18 = local_c0;
          if (uVar7 < (uint)local_a0) {
            piVar18 = local_60;
          }
          sVar9 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar21 + 5),(BYTE *)((long)(pBVar16 + uVar7) + 4),
                             (BYTE *)local_c0,(BYTE *)piVar18,local_78);
          uVar20 = sVar9 + 4;
        }
      }
      local_d0 = 999999999;
      if (local_94 == 6) {
        uVar10 = ZSTD_BtFindBestMatch_extDict_6(local_c8,(BYTE *)piVar21,(BYTE *)local_c0,&local_d0)
        ;
      }
      else if (local_94 == 5) {
        uVar10 = ZSTD_BtFindBestMatch_extDict_5(local_c8,(BYTE *)piVar21,(BYTE *)local_c0,&local_d0)
        ;
      }
      else {
        uVar10 = ZSTD_BtFindBestMatch_extDict_4(local_c8,(BYTE *)piVar21,(BYTE *)local_c0,&local_d0)
        ;
      }
      uVar14 = uVar20;
      if (uVar20 < uVar10) {
        uVar14 = uVar10;
      }
      if (uVar14 < 4) {
        local_c8->lazySkipping = (uint)(0x8ff < (ulong)((long)piVar21 - (long)local_50));
        src = local_50;
        piVar21 = (int *)((long)piVar21 + ((ulong)((long)piVar21 - (long)local_50) >> 8) + 1);
      }
      else {
        local_80 = piVar21;
        uVar24 = local_d0;
        if (uVar10 <= uVar20) {
          local_80 = (int *)((long)piVar21 + 1);
          uVar24 = 1;
        }
        uVar20 = local_58;
        local_b0 = uVar14;
        local_64 = UVar26;
        if (piVar21 < local_90) {
          do {
            piVar4 = local_c0;
            piVar18 = (int *)((long)piVar21 + 1);
            uVar23 = (int)uVar20 + 1;
            local_58 = uVar20;
            if (uVar24 == 0) {
              uVar24 = 0;
            }
            else {
              UVar26 = (local_c8->window).lowLimit;
              UVar13 = uVar23 - local_b4;
              if (uVar23 - UVar26 <= local_b4) {
                UVar13 = UVar26;
              }
              if (local_c8->loadedDictEnd != 0) {
                UVar13 = UVar26;
              }
              uVar7 = uVar23 - local_d4;
              pBVar16 = local_70;
              if (uVar7 < (uint)local_a0) {
                pBVar16 = local_a8;
              }
              if (((2 < local_b8 - uVar7) && (local_d4 <= uVar23 - UVar13)) &&
                 (*piVar18 == *(int *)(pBVar16 + uVar7))) {
                piVar15 = local_c0;
                if (uVar7 < (uint)local_a0) {
                  piVar15 = local_60;
                }
                sVar9 = ZSTD_count_2segments
                                  ((BYTE *)((long)piVar21 + 5),(BYTE *)((long)(pBVar16 + uVar7) + 4)
                                   ,(BYTE *)local_c0,(BYTE *)piVar15,local_78);
                if (sVar9 < 0xfffffffffffffffc) {
                  uVar7 = 0x1f;
                  if ((uint)uVar24 != 0) {
                    for (; (uint)uVar24 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                    }
                  }
                  if ((int)((uVar7 ^ 0x1f) + (int)local_b0 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
                    uVar24 = 1;
                    local_b0 = sVar9 + 4;
                    local_80 = piVar18;
                  }
                }
              }
            }
            local_d0 = 999999999;
            if (local_94 == 6) {
              uVar10 = ZSTD_BtFindBestMatch_extDict_6
                                 (local_c8,(BYTE *)piVar18,(BYTE *)piVar4,&local_d0);
            }
            else if (local_94 == 5) {
              uVar10 = ZSTD_BtFindBestMatch_extDict_5
                                 (local_c8,(BYTE *)piVar18,(BYTE *)piVar4,&local_d0);
            }
            else {
              uVar10 = ZSTD_BtFindBestMatch_extDict_4
                                 (local_c8,(BYTE *)piVar18,(BYTE *)piVar4,&local_d0);
            }
            piVar4 = local_c0;
            uVar7 = (uint)uVar24;
            if (uVar10 < 4) {
LAB_00153b1e:
              if (local_90 <= piVar18) break;
              piVar18 = (int *)((long)piVar21 + 2);
              uVar23 = (int)local_58 + 2;
              if (uVar24 == 0) {
                uVar24 = 0;
              }
              else {
                UVar26 = (local_c8->window).lowLimit;
                UVar13 = uVar23 - local_b4;
                if (uVar23 - UVar26 <= local_b4) {
                  UVar13 = UVar26;
                }
                if (local_c8->loadedDictEnd != 0) {
                  UVar13 = UVar26;
                }
                uVar8 = uVar23 - local_d4;
                pBVar16 = local_70;
                if (uVar8 < (uint)local_a0) {
                  pBVar16 = local_a8;
                }
                if (((2 < local_b8 - uVar8) && (local_d4 <= uVar23 - UVar13)) &&
                   (*piVar18 == *(int *)(pBVar16 + uVar8))) {
                  piVar15 = local_c0;
                  if (uVar8 < (uint)local_a0) {
                    piVar15 = local_60;
                  }
                  sVar9 = ZSTD_count_2segments
                                    ((BYTE *)((long)piVar21 + 6),
                                     (BYTE *)((long)(pBVar16 + uVar8) + 4),(BYTE *)local_c0,
                                     (BYTE *)piVar15,local_78);
                  if (sVar9 < 0xfffffffffffffffc) {
                    uVar8 = 0x1f;
                    if (uVar7 != 0) {
                      for (; uVar7 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                      }
                    }
                    if ((int)((uVar8 ^ 0x1f) + (int)local_b0 * 4 + -0x1e) < (int)(sVar9 + 4) * 4) {
                      uVar24 = 1;
                      local_b0 = sVar9 + 4;
                      local_80 = piVar18;
                    }
                  }
                }
              }
              local_d0 = 999999999;
              if (local_94 == 6) {
                uVar10 = ZSTD_BtFindBestMatch_extDict_6
                                   (local_c8,(BYTE *)piVar18,(BYTE *)piVar4,&local_d0);
              }
              else if (local_94 == 5) {
                uVar10 = ZSTD_BtFindBestMatch_extDict_5
                                   (local_c8,(BYTE *)piVar18,(BYTE *)piVar4,&local_d0);
              }
              else {
                uVar10 = ZSTD_BtFindBestMatch_extDict_4
                                   (local_c8,(BYTE *)piVar18,(BYTE *)piVar4,&local_d0);
              }
              if (uVar10 < 4) break;
              uVar7 = 0x1f;
              if ((uint)uVar24 != 0) {
                for (; (uint)uVar24 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                }
              }
              iVar6 = 0x1f;
              if ((uint)local_d0 != 0) {
                for (; (uint)local_d0 >> iVar6 == 0; iVar6 = iVar6 + -1) {
                }
              }
              if ((int)uVar10 * 4 - iVar6 <= (int)((uVar7 ^ 0x1f) + (int)local_b0 * 4 + -0x18))
              break;
            }
            else {
              uVar8 = 0x1f;
              if (uVar7 != 0) {
                for (; uVar7 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                }
              }
              iVar6 = 0x1f;
              if ((uint)local_d0 != 0) {
                for (; (uint)local_d0 >> iVar6 == 0; iVar6 = iVar6 + -1) {
                }
              }
              if ((int)uVar10 * 4 - iVar6 <= (int)((uVar8 ^ 0x1f) + (int)local_b0 * 4 + -0x1b))
              goto LAB_00153b1e;
            }
            piVar21 = piVar18;
            uVar20 = (ulong)uVar23;
            uVar24 = local_d0;
            local_b0 = uVar10;
            local_80 = piVar21;
          } while (piVar21 < local_90);
        }
        uVar20 = local_b0;
        piVar21 = local_80;
        if (3 < uVar24) {
          pBVar17 = (BYTE *)((long)local_80 + (3 - (long)(local_70 + uVar24)));
          pBVar11 = local_78;
          pBVar16 = local_70;
          if ((uint)pBVar17 < (uint)local_a0) {
            pBVar11 = local_38;
            pBVar16 = local_a8;
          }
          if ((local_50 < local_80) &&
             (uVar10 = (ulong)pBVar17 & 0xffffffff, pBVar11 < pBVar16 + uVar10)) {
            pBVar16 = pBVar16 + uVar10;
            do {
              piVar18 = (int *)((long)piVar21 + -1);
              pBVar16 = pBVar16 + -1;
              if ((*(BYTE *)piVar18 != *pBVar16) ||
                 (uVar20 = uVar20 + 1, piVar21 = piVar18, piVar18 <= local_50)) break;
            } while (pBVar11 < pBVar16);
          }
          local_64 = local_d4;
          local_d4 = (U32)uVar24 - 3;
        }
        if (local_88->maxNbSeq <=
            (ulong)((long)local_88->sequences - (long)local_88->sequencesStart >> 3)) {
LAB_0015413c:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_88->maxNbLit) {
LAB_0015411d:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar10 = (long)piVar21 - (long)local_50;
        pBVar16 = local_88->lit;
        if (local_88->litStart + local_88->maxNbLit < pBVar16 + uVar10) {
LAB_0015415b:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_c0 < piVar21) {
LAB_0015417a:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_48 < piVar21) {
          ZSTD_safecopyLiterals(pBVar16,(BYTE *)local_50,(BYTE *)piVar21,(BYTE *)local_48);
LAB_00153dd3:
          local_88->lit = local_88->lit + uVar10;
          if (0xffff < uVar10) {
            if (local_88->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_88->longLengthType = ZSTD_llt_literalLength;
            local_88->longLengthPos =
                 (U32)((ulong)((long)local_88->sequences - (long)local_88->sequencesStart) >> 3);
          }
        }
        else {
          uVar3 = *(undefined8 *)(local_50 + 2);
          *(undefined8 *)pBVar16 = *(undefined8 *)local_50;
          *(undefined8 *)(pBVar16 + 8) = uVar3;
          pBVar16 = local_88->lit;
          if (0x10 < uVar10) {
            if ((BYTE *)0xffffffffffffffe0 < pBVar16 + 0x10 + (-0x10 - (long)(local_50 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar3 = *(undefined8 *)(local_50 + 6);
            *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)(local_50 + 4);
            *(undefined8 *)(pBVar16 + 0x18) = uVar3;
            if (0x20 < (long)uVar10) {
              lVar19 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_50 + lVar19 + 0x20);
                uVar3 = puVar1[1];
                pBVar11 = pBVar16 + lVar19 + 0x20;
                *(undefined8 *)pBVar11 = *puVar1;
                *(undefined8 *)(pBVar11 + 8) = uVar3;
                puVar1 = (undefined8 *)((long)local_50 + lVar19 + 0x30);
                uVar3 = puVar1[1];
                *(undefined8 *)(pBVar11 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar11 + 0x18) = uVar3;
                lVar19 = lVar19 + 0x20;
              } while (pBVar11 + 0x20 < pBVar16 + uVar10);
            }
            goto LAB_00153dd3;
          }
          local_88->lit = pBVar16 + uVar10;
        }
        psVar5 = local_88;
        psVar25 = local_88->sequences;
        psVar25->litLength = (U16)uVar10;
        psVar25->offBase = (U32)uVar24;
        if (uVar20 < 3) {
LAB_001540fe:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar20 - 3) {
          if (local_88->longLengthType != ZSTD_llt_none) {
LAB_00154199:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_88->longLengthType = ZSTD_llt_matchLength;
          local_88->longLengthPos =
               (U32)((ulong)((long)psVar25 - (long)local_88->sequencesStart) >> 3);
        }
        psVar25->mlBase = (U16)(uVar20 - 3);
        psVar25 = psVar25 + 1;
        local_88->sequences = psVar25;
        if (local_c8->lazySkipping != 0) {
          local_c8->lazySkipping = 0;
        }
        src = (void *)((long)piVar21 + uVar20);
        piVar21 = (int *)src;
        UVar26 = local_64;
        UVar13 = local_64;
        if (src <= local_90) {
          do {
            uVar23 = UVar13;
            UVar13 = local_d4;
            iVar6 = (int)src - (int)local_70;
            UVar26 = (local_c8->window).lowLimit;
            UVar12 = iVar6 - local_b4;
            if (iVar6 - UVar26 <= local_b4) {
              UVar12 = UVar26;
            }
            if (local_c8->loadedDictEnd != 0) {
              UVar12 = UVar26;
            }
            uVar7 = iVar6 - uVar23;
            pBVar16 = local_70;
            if (uVar7 < (uint)local_a0) {
              pBVar16 = local_a8;
            }
            piVar21 = (int *)src;
            UVar26 = uVar23;
            local_d4 = UVar13;
            if (((local_b8 - uVar7 < 3) || (iVar6 - UVar12 < uVar23)) ||
               (*src != *(int *)(pBVar16 + uVar7))) break;
            piVar21 = local_c0;
            if (uVar7 < (uint)local_a0) {
              piVar21 = local_60;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar16 + uVar7) + 4),
                               (BYTE *)local_c0,(BYTE *)piVar21,local_78);
            if (psVar5->maxNbSeq <= (ulong)((long)psVar25 - (long)psVar5->sequencesStart >> 3))
            goto LAB_0015413c;
            if (0x20000 < psVar5->maxNbLit) goto LAB_0015411d;
            pBVar16 = psVar5->lit;
            if (psVar5->litStart + psVar5->maxNbLit < pBVar16) goto LAB_0015415b;
            if (local_c0 < src) goto LAB_0015417a;
            if (local_48 < src) {
              ZSTD_safecopyLiterals(pBVar16,(BYTE *)src,(BYTE *)src,(BYTE *)local_48);
            }
            else {
              uVar3 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar16 = *src;
              *(undefined8 *)(pBVar16 + 8) = uVar3;
            }
            psVar25 = psVar5->sequences;
            psVar25->litLength = 0;
            psVar25->offBase = 1;
            if (sVar9 + 4 < 3) goto LAB_001540fe;
            if (0xffff < sVar9 + 1) {
              if (psVar5->longLengthType != ZSTD_llt_none) goto LAB_00154199;
              psVar5->longLengthType = ZSTD_llt_matchLength;
              psVar5->longLengthPos =
                   (U32)((ulong)((long)psVar25 - (long)psVar5->sequencesStart) >> 3);
            }
            psVar25->mlBase = (U16)(sVar9 + 1);
            psVar25 = psVar25 + 1;
            psVar5->sequences = psVar25;
            src = (void *)((long)src + sVar9 + 4);
            piVar21 = (int *)src;
            UVar26 = UVar13;
            local_d4 = uVar23;
          } while (src <= local_90);
        }
      }
    } while (piVar21 < local_90);
  }
  *local_40 = local_d4;
  local_40[1] = UVar26;
  return (long)local_c0 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2);
}